

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O2

void test_ADynArray_append_failure_bufferExpansionFailed_fn(int _i)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *expr;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char c;
  code *local_48;
  code *pcStack_40;
  code *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_48 = private_ACUtilsTest_ADynArray_realloc;
  pcStack_40 = private_ACUtilsTest_ADynArray_free;
  local_30 = (char *)0x5;
  local_38 = private_ACUtilsTest_ADynArray_growStrategy;
  local_28 = (char *)0x5;
  private_ACUtilsTest_ADynArray_reallocFail = 0;
  local_20 = (char *)private_ACUtilsTest_ADynArray_realloc((void *)0x0,6);
  private_ACUtilsTest_ADynArray_reallocFailCounter = sVar2;
  builtin_strncpy(local_20,"01234",6);
  sVar1 = private_ACUtilsTest_ADynArray_reallocFailCounter;
  private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
  sVar2 = private_ACUtilsTest_ADynArray_reallocFailCounter;
  private_ACUtilsTest_ADynArray_reallocFail = 1;
  c = '\0';
  private_ACUtilsTest_ADynArray_reallocFailCounter = sVar1;
  bVar3 = private_ACUtils_ADynArray_insertArray(&local_48,0xffffffffffffffff,&c,1,1);
  if (bVar3 == false) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x513);
    if (local_30 == (char *)0x5) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                  ,0x514);
      if (local_28 == (char *)0x5) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x515);
        if (local_20 == (char *)0x0) {
          pcVar7 = (char *)0x0;
          expr = "Assertion \'_ck_x != NULL\' failed";
          pcVar6 = "Assertion \'%s\' failed: %s == %#x";
          pcVar8 = "(void*) array.buffer != NULL";
          pcVar9 = "(void*) array.buffer";
          iVar4 = 0x516;
          pcVar5 = (char *)0x0;
        }
        else {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x516);
          pcVar7 = local_20;
          if (local_20 == (char *)0x0) {
            pcVar5 = "";
            pcVar7 = "(null)";
          }
          else {
            iVar4 = strcmp("01234",local_20);
            if (iVar4 == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                          ,0x517);
              if (local_38 != (code *)0x0) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                            ,0x518);
                (*pcStack_40)(local_20);
                return;
              }
              pcVar7 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar6 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) array.growStrategy != NULL";
              pcVar9 = "(void*) array.growStrategy";
              iVar4 = 0x518;
              pcVar5 = (char *)0x0;
              goto LAB_00114e8a;
            }
            pcVar5 = "\"";
          }
          expr = 
          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
          ;
          pcVar6 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
          pcVar8 = "array.buffer == \"01234\"";
          pcVar9 = "array.buffer";
          iVar4 = 0x517;
        }
      }
      else {
        pcVar7 = "5";
        expr = "Assertion \'_ck_x == _ck_y\' failed";
        pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
        pcVar8 = "array.capacity == 5";
        pcVar9 = "array.capacity";
        iVar4 = 0x515;
        pcVar5 = local_28;
      }
    }
    else {
      pcVar7 = "5";
      expr = "Assertion \'_ck_x == _ck_y\' failed";
      pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
      pcVar8 = "array.size == 5";
      pcVar9 = "array.size";
      iVar4 = 0x514;
      pcVar5 = local_30;
    }
  }
  else {
    pcVar5 = (char *)(ulong)bVar3;
    pcVar7 = "false";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar6 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar8 = 
    "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer)) == false"
    ;
    pcVar9 = "private_ACUtils_ADynArray_insertArray(&array, -1, &(c), 1, sizeof(*(&array)->buffer))"
    ;
    iVar4 = 0x513;
  }
LAB_00114e8a:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,iVar4,expr,pcVar6,pcVar8,pcVar9,pcVar5,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_append_failure_bufferExpansionFailed)
{
    struct private_ACUtilsTest_ADynArray_CharArray array = {.reallocator = private_ACUtilsTest_ADynArray_realloc, .deallocator = private_ACUtilsTest_ADynArray_free};
    array.size = 5;
    array.growStrategy = private_ACUtilsTest_ADynArray_growStrategy;
    array.capacity = 5;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    array.buffer = (char*) array.reallocator(nullptr, array.capacity + 1);
    memcpy(array.buffer, "01234", 6);
    private_ACUtilsTest_ADynArray_reallocFailCounter = 0;
    private_ACUtilsTest_ADynArray_reallocFail = true;
    char c = '\0';
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_append(&array, c), false);
    ACUTILSTEST_ASSERT_UINT_EQ(array.size, 5);
    ACUTILSTEST_ASSERT_UINT_EQ(array.capacity, 5);
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.buffer);
    ACUTILSTEST_ASSERT_STR_EQ(array.buffer, "01234");
    ACUTILSTEST_ASSERT_PTR_NONNULL(array.growStrategy);
    array.deallocator(array.buffer);
}